

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toupperhashstrategy.cpp
# Opt level: O2

char * __thiscall ToUpperHashStrategy::hash(ToUpperHashStrategy *this,char *str)

{
  size_t sVar1;
  char *__s;
  ulong uVar2;
  ulong uVar3;
  
  sVar1 = strlen(str);
  uVar2 = (ulong)((int)sVar1 + 1);
  __s = (char *)operator_new__(uVar2);
  uVar3 = 0;
  memset(__s,0,uVar2);
  uVar2 = sVar1 & 0xffffffff;
  if ((int)sVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    __s[uVar3] = str[uVar3] + -0x20;
  }
  return __s;
}

Assistant:

char* ToUpperHashStrategy::hash(const char* str)
{
	int len = strlen(str);
	char* res = new char[len + 1];
	memset(res, 0x00, len + 1);

	for (int i = 0; i < len; ++i) {
		res[i] = toUpper(str[i]);
	}

	return res;

}